

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

void Omega_h::inject_map(LOs *a2b,Write<int> *b2a)

{
  undefined1 local_58 [8];
  type functor;
  Write<int> *b2a_local;
  LOs *a2b_local;
  ulong local_10;
  
  functor.a2b.write_.shared_alloc_.direct_ptr = b2a;
  Write<int>::Write((Write<int> *)local_58,b2a);
  Read<int>::Read((Read<int> *)&functor.b2a.shared_alloc_.direct_ptr,a2b);
  if (((ulong)(a2b->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a2b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a2b->write_).shared_alloc_.alloc >> 3;
  }
  parallel_for<Omega_h::inject_map(Omega_h::Read<int>,Omega_h::Write<int>)::__0>
            ("inject_map",(LO)(local_10 >> 2),(type *)local_58);
  inject_map(Omega_h::Read<int>,Omega_h::Write<int>)::$_0::~__0((__0 *)local_58);
  return;
}

Assistant:

void inject_map(LOs a2b, Write<LO> b2a) {
  auto functor = OMEGA_H_LAMBDA(LO a) { b2a[a2b[a]] = a; };
  parallel_for("inject_map", a2b.size(), std::move(functor));
}